

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O0

void SharpYuvFilterRow16_SSE2
               (int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out,int bit_depth)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint16_t uVar11;
  int max_00;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined8 *puVar15;
  long lVar16;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  byte in_R9B;
  short sVar17;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  int v1;
  int v0;
  int a0a1b0b1_1;
  int a1b0_1;
  int a0b1_1;
  __m128i i1;
  __m128i i0;
  __m128i h1;
  __m128i h0;
  __m128i g1;
  __m128i g0;
  __m128i f1;
  __m128i f0;
  __m128i e1;
  __m128i e0;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i a1b0_2;
  __m128i a0b1_2;
  __m128i a0a1b0b1_8;
  __m128i a0a1b0b1;
  __m128i a1b0;
  __m128i a0b1;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i zero;
  __m128i max;
  __m128i kCst8;
  int i;
  int max_y;
  int local_3cc;
  short local_3c8;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  max_00 = (1 << (in_R9B & 0x1f)) + -1;
  local_3c8 = (short)max_00;
  for (local_3cc = 0; local_3cc + 8 <= in_EDX; local_3cc = local_3cc + 8) {
    puVar15 = (undefined8 *)(in_RDI + (long)local_3cc * 2);
    uVar1 = *puVar15;
    uVar2 = puVar15[1];
    puVar15 = (undefined8 *)(in_RDI + 2 + (long)local_3cc * 2);
    uVar3 = *puVar15;
    uVar4 = puVar15[1];
    puVar15 = (undefined8 *)(in_RSI + (long)local_3cc * 2);
    uVar5 = *puVar15;
    uVar6 = puVar15[1];
    puVar15 = (undefined8 *)(in_RSI + 2 + (long)local_3cc * 2);
    uVar7 = *puVar15;
    uVar8 = puVar15[1];
    local_1d8 = (short)uVar1;
    sStack_1d6 = (short)((ulong)uVar1 >> 0x10);
    sStack_1d4 = (short)((ulong)uVar1 >> 0x20);
    sStack_1d2 = (short)((ulong)uVar1 >> 0x30);
    sStack_1d0 = (short)uVar2;
    sStack_1ce = (short)((ulong)uVar2 >> 0x10);
    sStack_1cc = (short)((ulong)uVar2 >> 0x20);
    sStack_1ca = (short)((ulong)uVar2 >> 0x30);
    local_1e8 = (short)uVar7;
    sStack_1e6 = (short)((ulong)uVar7 >> 0x10);
    sStack_1e4 = (short)((ulong)uVar7 >> 0x20);
    sStack_1e2 = (short)((ulong)uVar7 >> 0x30);
    sStack_1e0 = (short)uVar8;
    sStack_1de = (short)((ulong)uVar8 >> 0x10);
    sStack_1dc = (short)((ulong)uVar8 >> 0x20);
    sStack_1da = (short)((ulong)uVar8 >> 0x30);
    local_1f8 = (short)uVar3;
    sStack_1f6 = (short)((ulong)uVar3 >> 0x10);
    sStack_1f4 = (short)((ulong)uVar3 >> 0x20);
    sStack_1f2 = (short)((ulong)uVar3 >> 0x30);
    sStack_1f0 = (short)uVar4;
    sStack_1ee = (short)((ulong)uVar4 >> 0x10);
    sStack_1ec = (short)((ulong)uVar4 >> 0x20);
    sStack_1ea = (short)((ulong)uVar4 >> 0x30);
    local_208 = (short)uVar5;
    sStack_206 = (short)((ulong)uVar5 >> 0x10);
    sStack_204 = (short)((ulong)uVar5 >> 0x20);
    sStack_202 = (short)((ulong)uVar5 >> 0x30);
    sStack_200 = (short)uVar6;
    sStack_1fe = (short)((ulong)uVar6 >> 0x10);
    sStack_1fc = (short)((ulong)uVar6 >> 0x20);
    sStack_1fa = (short)((ulong)uVar6 >> 0x30);
    sVar17 = local_1d8 + local_1e8 + local_1f8 + local_208 + 8;
    sVar20 = sStack_1d6 + sStack_1e6 + sStack_1f6 + sStack_206 + 8;
    sVar21 = sStack_1d4 + sStack_1e4 + sStack_1f4 + sStack_204 + 8;
    sVar22 = sStack_1d2 + sStack_1e2 + sStack_1f2 + sStack_202 + 8;
    sVar23 = sStack_1d0 + sStack_1e0 + sStack_1f0 + sStack_200 + 8;
    sVar24 = sStack_1ce + sStack_1de + sStack_1ee + sStack_1fe + 8;
    sVar25 = sStack_1cc + sStack_1dc + sStack_1ec + sStack_1fc + 8;
    sVar26 = sStack_1ca + sStack_1da + sStack_1ea + sStack_1fa + 8;
    auVar10._2_2_ = (sStack_1d6 + sStack_1e6) * 2 + sVar20;
    auVar10._0_2_ = (local_1d8 + local_1e8) * 2 + sVar17;
    auVar10._4_2_ = (sStack_1d4 + sStack_1e4) * 2 + sVar21;
    auVar10._6_2_ = (sStack_1d2 + sStack_1e2) * 2 + sVar22;
    auVar10._8_2_ = (sStack_1d0 + sStack_1e0) * 2 + sVar23;
    auVar10._10_2_ = (sStack_1ce + sStack_1de) * 2 + sVar24;
    auVar10._12_2_ = (sStack_1cc + sStack_1dc) * 2 + sVar25;
    auVar10._14_2_ = (sStack_1ca + sStack_1da) * 2 + sVar26;
    auVar18 = psraw(auVar10,ZEXT416(3));
    auVar9._2_2_ = (sStack_1f6 + sStack_206) * 2 + sVar20;
    auVar9._0_2_ = (local_1f8 + local_208) * 2 + sVar17;
    auVar9._4_2_ = (sStack_1f4 + sStack_204) * 2 + sVar21;
    auVar9._6_2_ = (sStack_1f2 + sStack_202) * 2 + sVar22;
    auVar9._8_2_ = (sStack_1f0 + sStack_200) * 2 + sVar23;
    auVar9._10_2_ = (sStack_1ee + sStack_1fe) * 2 + sVar24;
    auVar9._12_2_ = (sStack_1ec + sStack_1fc) * 2 + sVar25;
    auVar9._14_2_ = (sStack_1ea + sStack_1fa) * 2 + sVar26;
    auVar19 = psraw(auVar9,ZEXT416(3));
    local_2d8 = auVar19._0_2_;
    sStack_2d6 = auVar19._2_2_;
    sStack_2d4 = auVar19._4_2_;
    sStack_2d2 = auVar19._6_2_;
    sStack_2d0 = auVar19._8_2_;
    sStack_2ce = auVar19._10_2_;
    sStack_2cc = auVar19._12_2_;
    sStack_2ca = auVar19._14_2_;
    local_2f8 = auVar18._0_2_;
    sStack_2f6 = auVar18._2_2_;
    sStack_2f4 = auVar18._4_2_;
    sStack_2f2 = auVar18._6_2_;
    sStack_2f0 = auVar18._8_2_;
    sStack_2ee = auVar18._10_2_;
    sStack_2ec = auVar18._12_2_;
    sStack_2ea = auVar18._14_2_;
    auVar19._2_2_ = sStack_2d6 + sStack_1d6;
    auVar19._0_2_ = local_2d8 + local_1d8;
    auVar19._4_2_ = sStack_2d4 + sStack_1d4;
    auVar19._6_2_ = sStack_2d2 + sStack_1d2;
    auVar19._10_2_ = sStack_2ce + sStack_1ce;
    auVar19._8_2_ = sStack_2d0 + sStack_1d0;
    auVar19._12_2_ = sStack_2cc + sStack_1cc;
    auVar19._14_2_ = sStack_2ca + sStack_1ca;
    auVar19 = psraw(auVar19,ZEXT416(1));
    auVar18._2_2_ = sStack_2f6 + sStack_1f6;
    auVar18._0_2_ = local_2f8 + local_1f8;
    auVar18._4_2_ = sStack_2f4 + sStack_1f4;
    auVar18._6_2_ = sStack_2f2 + sStack_1f2;
    auVar18._10_2_ = sStack_2ee + sStack_1ee;
    auVar18._8_2_ = sStack_2f0 + sStack_1f0;
    auVar18._12_2_ = sStack_2ec + sStack_1ec;
    auVar18._14_2_ = sStack_2ea + sStack_1ea;
    auVar18 = psraw(auVar18,ZEXT416(1));
    local_38 = auVar19._0_2_;
    sStack_36 = auVar19._2_2_;
    sStack_34 = auVar19._4_2_;
    sStack_32 = auVar19._6_2_;
    local_48 = auVar18._0_2_;
    sStack_46 = auVar18._2_2_;
    sStack_44 = auVar18._4_2_;
    sStack_42 = auVar18._6_2_;
    sStack_10 = auVar19._8_2_;
    sStack_e = auVar19._10_2_;
    sStack_c = auVar19._12_2_;
    sStack_a = auVar19._14_2_;
    sStack_20 = auVar18._8_2_;
    sStack_1e = auVar18._10_2_;
    sStack_1c = auVar18._12_2_;
    sStack_1a = auVar18._14_2_;
    puVar15 = (undefined8 *)(in_RCX + (long)(local_3cc << 1) * 2);
    uVar1 = *puVar15;
    uVar2 = puVar15[1];
    lVar16 = in_RCX + (long)(local_3cc << 1) * 2;
    uVar3 = *(undefined8 *)(lVar16 + 0x10);
    uVar4 = *(undefined8 *)(lVar16 + 0x18);
    local_318 = (short)uVar1;
    sStack_316 = (short)((ulong)uVar1 >> 0x10);
    sStack_314 = (short)((ulong)uVar1 >> 0x20);
    sStack_312 = (short)((ulong)uVar1 >> 0x30);
    sStack_310 = (short)uVar2;
    sStack_30e = (short)((ulong)uVar2 >> 0x10);
    sStack_30c = (short)((ulong)uVar2 >> 0x20);
    sStack_30a = (short)((ulong)uVar2 >> 0x30);
    local_318 = local_318 + local_38;
    sStack_316 = sStack_316 + local_48;
    sStack_314 = sStack_314 + sStack_36;
    sStack_312 = sStack_312 + sStack_46;
    sStack_310 = sStack_310 + sStack_34;
    sStack_30e = sStack_30e + sStack_44;
    sStack_30c = sStack_30c + sStack_32;
    sStack_30a = sStack_30a + sStack_42;
    local_338 = (short)uVar3;
    sStack_336 = (short)((ulong)uVar3 >> 0x10);
    sStack_334 = (short)((ulong)uVar3 >> 0x20);
    sStack_332 = (short)((ulong)uVar3 >> 0x30);
    sStack_330 = (short)uVar4;
    sStack_32e = (short)((ulong)uVar4 >> 0x10);
    sStack_32c = (short)((ulong)uVar4 >> 0x20);
    sStack_32a = (short)((ulong)uVar4 >> 0x30);
    local_338 = local_338 + sStack_10;
    sStack_336 = sStack_336 + sStack_20;
    sStack_334 = sStack_334 + sStack_e;
    sStack_332 = sStack_332 + sStack_1e;
    sStack_330 = sStack_330 + sStack_c;
    sStack_32e = sStack_32e + sStack_1c;
    sStack_32c = sStack_32c + sStack_a;
    sStack_32a = sStack_32a + sStack_1a;
    uVar27 = (ushort)(local_3c8 < local_318) * local_3c8 |
             (ushort)(local_3c8 >= local_318) * local_318;
    uVar29 = (ushort)(local_3c8 < sStack_316) * local_3c8 |
             (ushort)(local_3c8 >= sStack_316) * sStack_316;
    uVar31 = (ushort)(local_3c8 < sStack_314) * local_3c8 |
             (ushort)(local_3c8 >= sStack_314) * sStack_314;
    uVar33 = (ushort)(local_3c8 < sStack_312) * local_3c8 |
             (ushort)(local_3c8 >= sStack_312) * sStack_312;
    uVar35 = (ushort)(local_3c8 < sStack_310) * local_3c8 |
             (ushort)(local_3c8 >= sStack_310) * sStack_310;
    uVar37 = (ushort)(local_3c8 < sStack_30e) * local_3c8 |
             (ushort)(local_3c8 >= sStack_30e) * sStack_30e;
    uVar39 = (ushort)(local_3c8 < sStack_30c) * local_3c8 |
             (ushort)(local_3c8 >= sStack_30c) * sStack_30c;
    uVar41 = (ushort)(local_3c8 < sStack_30a) * local_3c8 |
             (ushort)(local_3c8 >= sStack_30a) * sStack_30a;
    uVar28 = (ushort)(local_3c8 < local_338) * local_3c8 |
             (ushort)(local_3c8 >= local_338) * local_338;
    uVar30 = (ushort)(local_3c8 < sStack_336) * local_3c8 |
             (ushort)(local_3c8 >= sStack_336) * sStack_336;
    uVar32 = (ushort)(local_3c8 < sStack_334) * local_3c8 |
             (ushort)(local_3c8 >= sStack_334) * sStack_334;
    uVar34 = (ushort)(local_3c8 < sStack_332) * local_3c8 |
             (ushort)(local_3c8 >= sStack_332) * sStack_332;
    uVar36 = (ushort)(local_3c8 < sStack_330) * local_3c8 |
             (ushort)(local_3c8 >= sStack_330) * sStack_330;
    uVar38 = (ushort)(local_3c8 < sStack_32e) * local_3c8 |
             (ushort)(local_3c8 >= sStack_32e) * sStack_32e;
    uVar40 = (ushort)(local_3c8 < sStack_32c) * local_3c8 |
             (ushort)(local_3c8 >= sStack_32c) * sStack_32c;
    uVar42 = (ushort)(local_3c8 < sStack_32a) * local_3c8 |
             (ushort)(local_3c8 >= sStack_32a) * sStack_32a;
    puVar15 = (undefined8 *)(in_R8 + (long)(local_3cc << 1) * 2);
    *puVar15 = CONCAT26((-1 < (short)uVar33) * uVar33,
                        CONCAT24((-1 < (short)uVar31) * uVar31,
                                 CONCAT22((-1 < (short)uVar29) * uVar29,
                                          (-1 < (short)uVar27) * uVar27)));
    puVar15[1] = CONCAT26((-1 < (short)uVar41) * uVar41,
                          CONCAT24((-1 < (short)uVar39) * uVar39,
                                   CONCAT22((-1 < (short)uVar37) * uVar37,
                                            (-1 < (short)uVar35) * uVar35)));
    lVar16 = in_R8 + (long)(local_3cc << 1) * 2;
    *(ulong *)(lVar16 + 0x10) =
         CONCAT26((-1 < (short)uVar34) * uVar34,
                  CONCAT24((-1 < (short)uVar32) * uVar32,
                           CONCAT22((-1 < (short)uVar30) * uVar30,(-1 < (short)uVar28) * uVar28)));
    *(ulong *)(lVar16 + 0x18) =
         CONCAT26((-1 < (short)uVar42) * uVar42,
                  CONCAT24((-1 < (short)uVar40) * uVar40,
                           CONCAT22((-1 < (short)uVar38) * uVar38,(-1 < (short)uVar36) * uVar36)));
  }
  for (; local_3cc < in_EDX; local_3cc = local_3cc + 1) {
    iVar12 = (int)*(short *)(in_RDI + (long)local_3cc * 2) +
             (int)*(short *)(in_RSI + (long)(local_3cc + 1) * 2);
    iVar13 = (int)*(short *)(in_RDI + (long)(local_3cc + 1) * 2) +
             (int)*(short *)(in_RSI + (long)local_3cc * 2);
    iVar14 = iVar12 + iVar13 + 8;
    sVar17 = *(short *)(in_RDI + (long)(local_3cc + 1) * 2);
    uVar11 = clip_SSE2((uint)*(ushort *)(in_RCX + (long)(local_3cc << 1) * 2) +
                       (*(short *)(in_RDI + (long)local_3cc * 2) * 8 + iVar13 * 2 + iVar14 >> 4),
                       max_00);
    *(uint16_t *)(in_R8 + (long)(local_3cc << 1) * 2) = uVar11;
    uVar11 = clip_SSE2((uint)*(ushort *)(in_RCX + (long)(local_3cc * 2 + 1) * 2) +
                       (sVar17 * 8 + iVar12 * 2 + iVar14 >> 4),max_00);
    *(uint16_t *)(in_R8 + (long)(local_3cc * 2 + 1) * 2) = uVar11;
  }
  return;
}

Assistant:

static void SharpYuvFilterRow16_SSE2(const int16_t* A, const int16_t* B,
                                     int len, const uint16_t* best_y,
                                     uint16_t* out, int bit_depth) {
  const int max_y = (1 << bit_depth) - 1;
  int i;
  const __m128i kCst8 = _mm_set1_epi16(8);
  const __m128i max = _mm_set1_epi16(max_y);
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(A + i + 0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(A + i + 1));
    const __m128i b0 = _mm_loadu_si128((const __m128i*)(B + i + 0));
    const __m128i b1 = _mm_loadu_si128((const __m128i*)(B + i + 1));
    const __m128i a0b1 = _mm_add_epi16(a0, b1);
    const __m128i a1b0 = _mm_add_epi16(a1, b0);
    const __m128i a0a1b0b1 = _mm_add_epi16(a0b1, a1b0);  // A0+A1+B0+B1
    const __m128i a0a1b0b1_8 = _mm_add_epi16(a0a1b0b1, kCst8);
    const __m128i a0b1_2 = _mm_add_epi16(a0b1, a0b1);    // 2*(A0+B1)
    const __m128i a1b0_2 = _mm_add_epi16(a1b0, a1b0);    // 2*(A1+B0)
    const __m128i c0 = _mm_srai_epi16(_mm_add_epi16(a0b1_2, a0a1b0b1_8), 3);
    const __m128i c1 = _mm_srai_epi16(_mm_add_epi16(a1b0_2, a0a1b0b1_8), 3);
    const __m128i d0 = _mm_add_epi16(c1, a0);
    const __m128i d1 = _mm_add_epi16(c0, a1);
    const __m128i e0 = _mm_srai_epi16(d0, 1);
    const __m128i e1 = _mm_srai_epi16(d1, 1);
    const __m128i f0 = _mm_unpacklo_epi16(e0, e1);
    const __m128i f1 = _mm_unpackhi_epi16(e0, e1);
    const __m128i g0 = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 0));
    const __m128i g1 = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 8));
    const __m128i h0 = _mm_add_epi16(g0, f0);
    const __m128i h1 = _mm_add_epi16(g1, f1);
    const __m128i i0 = _mm_max_epi16(_mm_min_epi16(h0, max), zero);
    const __m128i i1 = _mm_max_epi16(_mm_min_epi16(h1, max), zero);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 0), i0);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 8), i1);
  }
  for (; i < len; ++i) {
    //   (9 * A0 + 3 * A1 + 3 * B0 + B1 + 8) >> 4 =
    // = (8 * A0 + 2 * (A1 + B0) + (A0 + A1 + B0 + B1 + 8)) >> 4
    // We reuse the common sub-expressions.
    const int a0b1 = A[i + 0] + B[i + 1];
    const int a1b0 = A[i + 1] + B[i + 0];
    const int a0a1b0b1 = a0b1 + a1b0 + 8;
    const int v0 = (8 * A[i + 0] + 2 * a1b0 + a0a1b0b1) >> 4;
    const int v1 = (8 * A[i + 1] + 2 * a0b1 + a0a1b0b1) >> 4;
    out[2 * i + 0] = clip_SSE2(best_y[2 * i + 0] + v0, max_y);
    out[2 * i + 1] = clip_SSE2(best_y[2 * i + 1] + v1, max_y);
  }
}